

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

int evalfile(int f,int n)

{
  int iVar1;
  char *pcVar2;
  int ret;
  char *bufp;
  char fname [1024];
  FILE *local_20;
  FILE *ffp;
  int local_10;
  int n_local;
  int f_local;
  
  ffp._4_4_ = n;
  local_10 = f;
  pcVar2 = eread("Load file: ",(char *)&bufp,0x400,0x18);
  if (pcVar2 == (char *)0x0) {
    n_local = 2;
  }
  else if (*pcVar2 == '\0') {
    n_local = 0;
  }
  else {
    pcVar2 = adjustname((char *)&bufp,1);
    if (pcVar2 == (char *)0x0) {
      n_local = 0;
    }
    else {
      iVar1 = ffropen(&local_20,pcVar2,(buffer *)0x0);
      if (iVar1 == 5) {
        ffclose(local_20,(buffer *)0x0);
      }
      if (iVar1 == 0) {
        iVar1 = load(local_20,pcVar2);
        ffclose(local_20,(buffer *)0x0);
        n_local = iVar1;
      }
      else {
        n_local = 0;
      }
    }
  }
  return n_local;
}

Assistant:

int
evalfile(int f, int n)
{
	FILE	*ffp;
	char	 fname[NFILEN], *bufp;
	int	 ret;

	if ((bufp = eread("Load file: ", fname, NFILEN,
	    EFNEW | EFCR)) == NULL)
		return (ABORT);
	if (bufp[0] == '\0')
		return (FALSE);
	if ((bufp = adjustname(fname, TRUE)) == NULL)
		return (FALSE);
	ret = ffropen(&ffp, bufp, NULL);
	if (ret == FIODIR)
		(void)ffclose(ffp, NULL);
	if (ret != FIOSUC)
		return (FALSE);
	ret = load(ffp, bufp);
	(void)ffclose(ffp, NULL);
	return (ret);
}